

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C1540.cpp
# Opt level: O0

void __thiscall Commodore::C1540::MachineBase::process_input_bit(MachineBase *this,int value)

{
  bool bVar1;
  int value_local;
  MachineBase *this_local;
  
  this->shift_register_ = this->shift_register_ << 1 | value;
  if ((this->shift_register_ & 0x3ffU) == 0x3ff) {
    DriveVIA::set_sync_detected(&this->drive_VIA_port_handler_,true);
    this->bit_window_offset_ = -1;
  }
  else {
    DriveVIA::set_sync_detected(&this->drive_VIA_port_handler_,false);
  }
  this->bit_window_offset_ = this->bit_window_offset_ + 1;
  if (this->bit_window_offset_ == 8) {
    DriveVIA::set_data_input(&this->drive_VIA_port_handler_,(uint8_t)this->shift_register_);
    this->bit_window_offset_ = 0;
    bVar1 = DriveVIA::get_should_set_overflow(&this->drive_VIA_port_handler_);
    if (bVar1) {
      CPU::MOS6502::ProcessorBase::set_overflow_line(&(this->m6502_).super_ProcessorBase,true);
    }
  }
  else {
    CPU::MOS6502::ProcessorBase::set_overflow_line(&(this->m6502_).super_ProcessorBase,false);
  }
  return;
}

Assistant:

void MachineBase::process_input_bit(int value) {
	shift_register_ = (shift_register_ << 1) | value;
	if((shift_register_ & 0x3ff) == 0x3ff) {
		drive_VIA_port_handler_.set_sync_detected(true);
		bit_window_offset_ = -1; // i.e. this bit isn't the first within a data window, but the next might be
	} else {
		drive_VIA_port_handler_.set_sync_detected(false);
	}
	bit_window_offset_++;
	if(bit_window_offset_ == 8) {
		drive_VIA_port_handler_.set_data_input(uint8_t(shift_register_));
		bit_window_offset_ = 0;
		if(drive_VIA_port_handler_.get_should_set_overflow()) {
			m6502_.set_overflow_line(true);
		}
	}
	else m6502_.set_overflow_line(false);
}